

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

void Saig_ManDemiterMarkPos(Aig_Man_t *p)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  Aig_ManCleanMarkAB(p);
  for (iVar4 = 0; iVar4 < p->nRegs; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar4);
    *(ulong *)((long)pvVar2 + 0x18) =
         *(ulong *)((long)pvVar2 + 0x18) | (ulong)(p->nRegs / 2 <= iVar4) * 0x10 + 0x10;
  }
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar2 = Vec_PtrEntry(p->vObjs,iVar4);
    if ((pvVar2 != (void *)0x0) &&
       (uVar1 = *(ulong *)((long)pvVar2 + 0x18), 0xfffffffd < ((uint)uVar1 & 7) - 7)) {
      uVar3 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
      uVar5 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
      uVar6 = (ulong)((*(uint *)(uVar5 + 0x18) | *(uint *)(uVar3 + 0x18)) & 0x10);
      *(ulong *)((long)pvVar2 + 0x18) = uVar1 & 0xffffffffffffffef | uVar6;
      *(ulong *)((long)pvVar2 + 0x18) =
           uVar1 & 0xffffffffffffffcf | uVar6 |
           (ulong)((*(uint *)(uVar5 + 0x18) | *(uint *)(uVar3 + 0x18)) & 0x20);
    }
  }
  return;
}

Assistant:

void Saig_ManDemiterMarkPos( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkAB( p );
    Saig_ManForEachLo( p, pObj, i )
        if ( i < Saig_ManRegNum(p)/2 )
            pObj->fMarkA = 1;
        else
            pObj->fMarkB = 1;
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->fMarkA = Aig_ObjFanin0(pObj)->fMarkA | Aig_ObjFanin1(pObj)->fMarkA;
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB | Aig_ObjFanin1(pObj)->fMarkB;
    }
}